

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.cpp
# Opt level: O1

Container * __thiscall Container::add(Container *this,Person *person)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)person;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->people).super__List_base<Person_*,_std::allocator<Person_*>_>._M_impl._M_node.
            _M_size;
  *psVar1 = *psVar1 + 1;
  return this;
}

Assistant:

Container& Container::add(Person* person){
    people.push_back(person);
    return *this;
}